

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildStructConstructor
          (SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  FieldDef *pFVar3;
  StructDef *pSVar4;
  string *this_01;
  pointer ppFVar5;
  Type type;
  allocator<char> local_149;
  SwiftGenerator *local_148;
  StructDef *local_140;
  Type local_138;
  IdlNamer *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_140 = struct_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) {",
             (allocator<char> *)&local_138);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"let {{ACCESS}} = Struct(bb: bb, position: o)",
             (allocator<char> *)&local_138);
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_118 = &this->namer_;
  pSVar4 = local_140;
  local_148 = this;
  for (ppFVar5 = (local_140->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 !=
      (pSVar4->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar5 = ppFVar5 + 1) {
    pFVar3 = *ppFVar5;
    if (pFVar3->deprecated == false) {
      local_138.base_type = (pFVar3->value).type.base_type;
      local_138.element = (pFVar3->value).type.element;
      local_138.struct_def = (pFVar3->value).type.struct_def;
      local_138.enum_def = (pFVar3->value).type.enum_def;
      local_138.fixed_length = (pFVar3->value).type.fixed_length;
      local_138._26_6_ = *(undefined6 *)&(pFVar3->value).type.field_0x1a;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"FIELDVAR",&local_149);
      (*(local_118->super_Namer)._vptr_Namer[7])(&local_110,local_118,pFVar3);
      CodeWriter::SetValue(this_00,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"VALUETYPE",&local_149)
      ;
      GenType_abi_cxx11_(&local_110,local_148,&local_138,false);
      CodeWriter::SetValue(this_00,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"OFFSET",&local_149);
      NumToString<unsigned_short>(&local_110,(pFVar3->value).offset);
      CodeWriter::SetValue(this_00,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      if (local_138.base_type - BASE_TYPE_UTYPE < 0xc) {
        if ((local_138.base_type - BASE_TYPE_UTYPE < 10) && (local_138.enum_def != (EnumDef *)0x0))
        {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"VALUETYPE",&local_149);
          GenTypeBasic_abi_cxx11_(&local_110,local_148,&(pFVar3->value).type,false);
          CodeWriter::SetValue(this_00,&local_f0,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "_{{FIELDVAR}} = {{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: {{OFFSET}})",
                   (allocator<char> *)&local_f0);
        CodeWriter::operator+=(this_00,&local_50);
        this_01 = &local_50;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "_{{FIELDVAR}} = {{VALUETYPE}}({{ACCESS}}.bb, o: {{ACCESS}}.position + {{OFFSET}})"
                   ,(allocator<char> *)&local_f0);
        CodeWriter::operator+=(this_00,&local_70);
        this_01 = &local_70;
      }
      std::__cxx11::string::~string((string *)this_01);
      pSVar4 = local_140;
    }
  }
  iVar2 = (local_148->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (local_148->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"}\n",(allocator<char> *)&local_138);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void BuildStructConstructor(const StructDef &struct_def) {
    code_ += "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) {";
    Indent();
    code_ += "let {{ACCESS}} = Struct(bb: bb, position: o)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto type = field.value.type;
      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("VALUETYPE", GenType(type));
      code_.SetValue("OFFSET", NumToString(field.value.offset));
      if (IsScalar(type.base_type)) {
        if (IsEnum(type))
          code_.SetValue("VALUETYPE", GenTypeBasic(field.value.type, false));
        code_ +=
            "_{{FIELDVAR}} = {{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, "
            "at: {{OFFSET}})";
      } else {
        code_ +=
            "_{{FIELDVAR}} = {{VALUETYPE}}({{ACCESS}}.bb, o: "
            "{{ACCESS}}.position + {{OFFSET}})";
      }
    }
    Outdent();
    code_ += "}\n";
  }